

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_socket_utils.c
# Opt level: O3

void setUp(void)

{
  memset(&fff,0,0x194);
  memset(&socket_fake,0,0x368);
  socket_fake.arg_history_len = 0x32;
  memset(&getsockopt_fake,0,0x698);
  getsockopt_fake.arg_history_len = 0x32;
  memset(&setsockopt_fake,0,0x5d0);
  setsockopt_fake.arg_history_len = 0x32;
  memset(&close_fake,0,0x1d0);
  close_fake.arg_history_len = 0x32;
  return;
}

Assistant:

void setUp(void)
{
	FFF_RESET_HISTORY()
	RESET_FAKE(socket)
	RESET_FAKE(getsockopt)
	RESET_FAKE(setsockopt)
	RESET_FAKE(close)
}

void tearDown(void)
{
}

static void test_create_inet4_socket(void)
{
	int socket_fd = 5;
	socket_fake.return_val = socket_fd;
	int ret = cio_linux_socket_create(CIO_ADDRESS_FAMILY_INET4);

	TEST_ASSERT_EQUAL(ret, socket_fd);
	TEST_ASSERT_EQUAL(1, socket_fake.call_count);
}

static void test_create_inet6_socket(void)
{
	int socket_fd = 5;
	socket_fake.return_val = socket_fd;
	int ret = cio_linux_socket_create(CIO_ADDRESS_FAMILY_INET6);

	TEST_ASSERT_EQUAL(ret, socket_fd);
	TEST_ASSERT_EQUAL(1, socket_fake.call_count);
}

static void test_create_inet6_socket_set_ipv6_only_fails(void)
{
	int socket_fd = 5;
	socket_fake.return_val = socket_fd;
	setsockopt_fake.return_val = -1;
	int ret = cio_linux_socket_create(CIO_ADDRESS_FAMILY_INET6);

	TEST_ASSERT_EQUAL(ret, -1);
	TEST_ASSERT_EQUAL(1, socket_fake.call_count);
	TEST_ASSERT_EQUAL(1, close_fake.call_count);
}

static void test_create_socket_fails(void)
{
	socket_fake.return_val = -1;
	int ret = cio_linux_socket_create(CIO_ADDRESS_FAMILY_INET4);

	TEST_ASSERT_EQUAL(-1, ret);
	TEST_ASSERT_EQUAL(1, socket_fake.call_count);
}

static void test_create_socket_wrong_family(void)
{
	int socket_fd = 5;
	socket_fake.return_val = socket_fd;
	int ret = cio_linux_socket_create(CIO_ADDRESS_FAMILY_UNSPEC);

	TEST_ASSERT_EQUAL_MESSAGE(-1, ret, "wrong return value if called with illegal address family!");
	TEST_ASSERT_EQUAL(0, socket_fake.call_count);
}

static void test_get_socket_error_success(void)
{
	getsockopt_fake.custom_fake = getsockopt_ok;
	enum cio_error err = cio_linux_get_socket_error(5);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_NO_BUFFER_SPACE, err, "Wrong error value!");
}

static void test_get_socket_error_failue(void)
{
	getsockopt_fake.custom_fake = getsockopt_error;
	enum cio_error err = cio_linux_get_socket_error(5);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_INVALID_ARGUMENT, err, "Wrong error value!");
}

int main(void)
{
	UNITY_BEGIN();
	RUN_TEST(test_create_inet4_socket);
	RUN_TEST(test_create_inet6_socket);
	RUN_TEST(test_create_inet6_socket_set_ipv6_only_fails);
	RUN_TEST(test_create_socket_fails);
	RUN_TEST(test_create_socket_wrong_family);
	RUN_TEST(test_get_socket_error_success);
	RUN_TEST(test_get_socket_error_failue);
	return UNITY_END();
}